

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O2

void intgemm::AVX512BW::Kernels8::Quantize(float *input,int8_t *output,float quant_mult,Index size)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  ulong count;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  
  count = (ulong)(size & 0xfffffff0);
  QuantizeThread(input,output,quant_mult,count);
  if ((size & 0xf) != 0) {
    auVar20 = vbroadcastss_avx512f(ZEXT416((uint)quant_mult));
    auVar20 = vmulps_avx512f(auVar20,*(undefined1 (*) [64])(input + count));
    auVar21 = vcvtps2dq_avx512f(auVar20);
    auVar20._8_4_ = 0xffffff81;
    auVar20._0_8_ = 0xffffff81ffffff81;
    auVar20._12_4_ = 0xffffff81;
    auVar20._16_4_ = 0xffffff81;
    auVar20._20_4_ = 0xffffff81;
    auVar20._24_4_ = 0xffffff81;
    auVar20._28_4_ = 0xffffff81;
    auVar20._32_4_ = 0xffffff81;
    auVar20._36_4_ = 0xffffff81;
    auVar20._40_4_ = 0xffffff81;
    auVar20._44_4_ = 0xffffff81;
    auVar20._48_4_ = 0xffffff81;
    auVar20._52_4_ = 0xffffff81;
    auVar20._56_4_ = 0xffffff81;
    auVar20._60_4_ = 0xffffff81;
    auVar20 = vpmaxsd_avx512f(auVar21,auVar20);
    uVar18 = ~(-1 << ((byte)size & 0xf));
    pbVar1 = (byte *)(output + count);
    auVar19 = vpmovsdb_avx512f(auVar20);
    bVar2 = (bool)((byte)uVar18 & 1);
    bVar3 = (bool)((byte)(uVar18 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar18 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar18 >> 7) & 1);
    bVar10 = (bool)((byte)(uVar18 >> 8) & 1);
    bVar11 = (bool)((byte)(uVar18 >> 9) & 1);
    bVar12 = (bool)((byte)(uVar18 >> 10) & 1);
    bVar13 = (bool)((byte)(uVar18 >> 0xb) & 1);
    bVar14 = (bool)((byte)(uVar18 >> 0xc) & 1);
    bVar15 = (bool)((byte)(uVar18 >> 0xd) & 1);
    bVar16 = (bool)((byte)(uVar18 >> 0xe) & 1);
    bVar17 = (bool)((byte)(uVar18 >> 0xf) & 1);
    *pbVar1 = bVar2 * auVar19[0] | !bVar2 * *pbVar1;
    pbVar1[1] = bVar3 * auVar19[1] | !bVar3 * pbVar1[1];
    pbVar1[2] = bVar4 * auVar19[2] | !bVar4 * pbVar1[2];
    pbVar1[3] = bVar5 * auVar19[3] | !bVar5 * pbVar1[3];
    pbVar1[4] = bVar6 * auVar19[4] | !bVar6 * pbVar1[4];
    pbVar1[5] = bVar7 * auVar19[5] | !bVar7 * pbVar1[5];
    pbVar1[6] = bVar8 * auVar19[6] | !bVar8 * pbVar1[6];
    pbVar1[7] = bVar9 * auVar19[7] | !bVar9 * pbVar1[7];
    pbVar1[8] = bVar10 * auVar19[8] | !bVar10 * pbVar1[8];
    pbVar1[9] = bVar11 * auVar19[9] | !bVar11 * pbVar1[9];
    pbVar1[10] = bVar12 * auVar19[10] | !bVar12 * pbVar1[10];
    pbVar1[0xb] = bVar13 * auVar19[0xb] | !bVar13 * pbVar1[0xb];
    pbVar1[0xc] = bVar14 * auVar19[0xc] | !bVar14 * pbVar1[0xc];
    pbVar1[0xd] = bVar15 * auVar19[0xd] | !bVar15 * pbVar1[0xd];
    pbVar1[0xe] = bVar16 * auVar19[0xe] | !bVar16 * pbVar1[0xe];
    pbVar1[0xf] = bVar17 * auVar19[0xf] | !bVar17 * pbVar1[0xf];
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Quantize(const float *input, int8_t *output, float quant_mult, Index size) {
    assert(reinterpret_cast<uintptr_t>(input) % sizeof(__m512i) == 0);
    const std::size_t kBatch = sizeof(__m512i) / sizeof(float);
    std::size_t fast_size = (size & ~(kBatch - 1));
    const float *fast_input_end = input + fast_size;
    int8_t *fast_output_end = output + fast_size;
#pragma omp parallel
    {
      QuantizeThread(input, output, quant_mult, fast_size);
    }
    std::size_t overhang = size & (kBatch - 1);
    if (!overhang) return; // We needed a branch anyway for the empty case.
    const __m512i neg127 = _mm512_set1_epi32(-127);
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    __m512i asint = QuantizerGrab(fast_input_end, quant_mult_reg);
    asint = _mm512_max_epi32(asint, neg127);
    _mm512_mask_cvtsepi32_storeu_epi8(fast_output_end, (1 << overhang) - 1, asint);
  }